

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::Description_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneLibC *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = "UTC";
  if (this->local_ != false) {
    pcVar2 = "localtime";
  }
  pcVar1 = pcVar2 + 3;
  if (this->local_ != false) {
    pcVar1 = pcVar2 + 9;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneLibC::Description() const {
  return local_ ? "localtime" : "UTC";
}